

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGB4444ToARGBRow_C(uint8_t *src_argb4444,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      bVar1 = src_argb4444[lVar3 * 2];
      bVar2 = src_argb4444[lVar3 * 2 + 1];
      dst_argb[lVar3 * 4] = bVar1 << 4 | bVar1 & 0xf;
      dst_argb[lVar3 * 4 + 1] = bVar1 & 0xf0 | bVar1 >> 4;
      dst_argb[lVar3 * 4 + 2] = bVar2 << 4 | bVar2 & 0xf;
      dst_argb[lVar3 * 4 + 3] = bVar2 & 0xf0 | bVar2 >> 4;
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void ARGB4444ToARGBRow_C(const uint8_t* src_argb4444,
                         uint8_t* dst_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb4444[0] & 0x0f;
    uint8_t g = src_argb4444[0] >> 4;
    uint8_t r = src_argb4444[1] & 0x0f;
    uint8_t a = src_argb4444[1] >> 4;
    dst_argb[0] = (b << 4) | b;
    dst_argb[1] = (g << 4) | g;
    dst_argb[2] = (r << 4) | r;
    dst_argb[3] = (a << 4) | a;
    dst_argb += 4;
    src_argb4444 += 2;
  }
}